

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void stbi__YCbCr_to_RGB_row(stbi_uc *out,stbi_uc *y,stbi_uc *pcb,stbi_uc *pcr,int count,int step)

{
  int iVar1;
  stbi_uc *psVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  
  if (0 < count) {
    psVar2 = out + 3;
    uVar3 = 0;
    do {
      iVar1 = (uint)y[uVar3] * 0x100000;
      iVar4 = (int)((pcr[uVar3] - 0x80) * 0x166f00 + iVar1 + 0x80000) >> 0x14;
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      if (0xfe < iVar4) {
        iVar4 = 0xff;
      }
      iVar5 = ((pcb[uVar3] - 0x80) * -0x58200 & 0xffff0000) +
              (pcr[uVar3] - 0x80) * -0xb6d00 + iVar1 + 0x80000;
      if (iVar5 >> 0x14 < 1) {
        iVar5 = 0;
      }
      iVar5 = iVar5 >> 0x14;
      if (0xfe < iVar5) {
        iVar5 = 0xff;
      }
      iVar1 = (int)(iVar1 + (pcb[uVar3] - 0x80) * 0x1c5a00 + 0x80000) >> 0x14;
      if (iVar1 < 1) {
        iVar1 = 0;
      }
      if (0xfe < iVar1) {
        iVar1 = 0xff;
      }
      psVar2[-3] = (stbi_uc)iVar4;
      psVar2[-2] = (stbi_uc)iVar5;
      psVar2[-1] = (stbi_uc)iVar1;
      *psVar2 = 0xff;
      uVar3 = uVar3 + 1;
      psVar2 = psVar2 + step;
    } while ((uint)count != uVar3);
  }
  return;
}

Assistant:

static void stbi__YCbCr_to_RGB_row(stbi_uc *out, const stbi_uc *y, const stbi_uc *pcb, const stbi_uc *pcr, int count, int step)
{
   int i;
   for (i=0; i < count; ++i) {
      int y_fixed = (y[i] << 20) + (1<<19); // rounding
      int r,g,b;
      int cr = pcr[i] - 128;
      int cb = pcb[i] - 128;
      r = y_fixed +  cr* float2fixed(1.40200f);
      g = y_fixed + (cr*-float2fixed(0.71414f)) + ((cb*-float2fixed(0.34414f)) & 0xffff0000);
      b = y_fixed                               +   cb* float2fixed(1.77200f);
      r >>= 20;
      g >>= 20;
      b >>= 20;
      if ((unsigned) r > 255) { if (r < 0) r = 0; else r = 255; }
      if ((unsigned) g > 255) { if (g < 0) g = 0; else g = 255; }
      if ((unsigned) b > 255) { if (b < 0) b = 0; else b = 255; }
      out[0] = (stbi_uc)r;
      out[1] = (stbi_uc)g;
      out[2] = (stbi_uc)b;
      out[3] = 255;
      out += step;
   }
}